

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_wrap_transform_base.h
# Opt level: O0

int * __thiscall
draco::PredictionSchemeWrapTransformBase<int>::ClampPredictedValue
          (PredictionSchemeWrapTransformBase<int> *this,int *predicted_val)

{
  value_type vVar1;
  int iVar2;
  reference pvVar3;
  int *piVar4;
  long in_RSI;
  PredictionSchemeWrapTransformBase<int> *in_RDI;
  int i;
  int local_14;
  
  for (local_14 = 0; iVar2 = num_components(in_RDI), local_14 < iVar2; local_14 = local_14 + 1) {
    if (in_RDI->max_value_ < *(int *)(in_RSI + (long)local_14 * 4)) {
      vVar1 = in_RDI->max_value_;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&in_RDI->clamped_value_,(long)local_14);
      *pvVar3 = vVar1;
    }
    else if (*(int *)(in_RSI + (long)local_14 * 4) < in_RDI->min_value_) {
      vVar1 = in_RDI->min_value_;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&in_RDI->clamped_value_,(long)local_14);
      *pvVar3 = vVar1;
    }
    else {
      vVar1 = *(value_type *)(in_RSI + (long)local_14 * 4);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&in_RDI->clamped_value_,(long)local_14);
      *pvVar3 = vVar1;
    }
  }
  piVar4 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x1e3aee);
  return piVar4;
}

Assistant:

inline const DataTypeT *ClampPredictedValue(
      const DataTypeT *predicted_val) const {
    for (int i = 0; i < this->num_components(); ++i) {
      if (predicted_val[i] > max_value_) {
        clamped_value_[i] = max_value_;
      } else if (predicted_val[i] < min_value_) {
        clamped_value_[i] = min_value_;
      } else {
        clamped_value_[i] = predicted_val[i];
      }
    }
    return clamped_value_.data();
  }